

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,REF_GRID to_grid)

{
  double dVar1;
  REF_INTERP ref_interp;
  REF_NODE pRVar2;
  uint uVar3;
  long lVar4;
  REF_INT *cell;
  undefined8 uVar5;
  REF_DBL *pRVar6;
  long lVar7;
  ulong uVar8;
  REF_DBL *bary;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  REF_GRID from_grid;
  REF_DBL max_error;
  
  uVar3 = ref_grid_deep_copy(&from_grid,to_grid);
  if (uVar3 == 0) {
    uVar3 = ref_interp_create(ref_interp_ptr,from_grid,to_grid);
    if (uVar3 == 0) {
      ref_interp = *ref_interp_ptr;
      pRVar2 = to_grid->node;
      ref_interp->continuously = 1;
      lVar12 = 0;
      lVar7 = 0;
      lVar11 = 0;
      for (lVar10 = 0; lVar10 < pRVar2->max; lVar10 = lVar10 + 1) {
        if ((-1 < *(long *)((long)pRVar2->global + lVar12 * 2)) &&
           (pRVar2->ref_mpi->id == *(int *)((long)pRVar2->part + lVar12))) {
          lVar4 = (long)*(int *)((long)ref_interp->cell + lVar12);
          if (lVar4 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x102,"ref_interp_create_identity","identity already found?",0xffffffffffffffff,
                   lVar4);
            return 1;
          }
          cell = (REF_INT *)((long)ref_interp->cell + lVar12);
          pRVar6 = (REF_DBL *)((long)pRVar2->real + lVar11);
          bary = (REF_DBL *)((long)ref_interp->bary + lVar7);
          if (to_grid->twod == 0) {
            uVar3 = ref_interp_exhaustive_tet_around_node
                              (ref_interp,(REF_INT)lVar10,pRVar6,cell,bary);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar9 = "tet around node";
              uVar5 = 0x10c;
              goto LAB_001609cf;
            }
          }
          else {
            uVar3 = ref_interp_exhaustive_tri_around_node
                              (ref_interp,(REF_INT)lVar10,pRVar6,cell,bary);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar9 = "tri around node";
              uVar5 = 0x107;
              goto LAB_001609cf;
            }
          }
          *(REF_INT *)((long)ref_interp->part + lVar12) = from_grid->mpi->id;
          pRVar6 = ref_interp->bary;
          dVar1 = ref_interp->inside;
          if ((((*(double *)((long)pRVar6 + lVar7) < dVar1) ||
               (*(double *)((long)pRVar6 + lVar7 + 8) < dVar1)) ||
              (*(double *)((long)pRVar6 + lVar7 + 0x10) < dVar1)) ||
             (*(double *)((long)pRVar6 + lVar7 + 0x18) < dVar1)) {
            printf("info bary %e %e %e %e identity tol\n",*(double *)((long)pRVar6 + lVar7),
                   *(undefined8 *)((long)pRVar6 + lVar7 + 8),
                   *(undefined8 *)((long)pRVar6 + lVar7 + 0x10),
                   *(undefined8 *)((long)pRVar6 + lVar7 + 0x18));
          }
        }
        lVar11 = lVar11 + 0x78;
        lVar7 = lVar7 + 0x20;
        lVar12 = lVar12 + 4;
      }
      uVar3 = ref_interp_max_error(ref_interp,&max_error);
      if (uVar3 == 0) {
        if (to_grid->mpi->id != 0) {
          return 0;
        }
        if (max_error <= 1e-12) {
          return 0;
        }
        printf("warning %e max error for identity background grid\n");
        return 0;
      }
      uVar8 = (ulong)uVar3;
      pcVar9 = "max error";
      uVar5 = 0x117;
    }
    else {
      uVar8 = (ulong)uVar3;
      pcVar9 = "create";
      uVar5 = 0xf9;
    }
  }
  else {
    uVar8 = (ulong)uVar3;
    pcVar9 = "import";
    uVar5 = 0xf8;
  }
LAB_001609cf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar5,
         "ref_interp_create_identity",uVar8,pcVar9);
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,
                                              REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE to_node;
  REF_INT node;
  REF_DBL max_error;

  RSS(ref_grid_deep_copy(&from_grid, to_grid), "import");
  RSS(ref_interp_create(ref_interp_ptr, from_grid, to_grid), "create");

  ref_interp = *ref_interp_ptr;
  to_node = ref_grid_node(to_grid);

  ref_interp_continuously(ref_interp) = REF_TRUE;

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      REIS(REF_EMPTY, ref_interp->cell[node], "identity already found?");
      if (ref_grid_twod(to_grid)) {
        RSS(ref_interp_exhaustive_tri_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tri around node");
      } else {
        RSS(ref_interp_exhaustive_tet_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tet around node");
      }
      ref_interp->part[node] = ref_mpi_rank(ref_grid_mpi(from_grid));
      if (!ref_interp_bary_inside(ref_interp, &(ref_interp->bary[4 * node]))) {
        printf("info bary %e %e %e %e identity tol\n",
               ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node],
               ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]);
      }
    }
  }

  RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
  if (ref_mpi_once(ref_grid_mpi(to_grid)) && max_error > 1.0e-12) {
    printf("warning %e max error for identity background grid\n", max_error);
  }

  return REF_SUCCESS;
}